

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O3

void __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::renderDataIntoMultisampledTexture
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,GLenum target)

{
  int iVar1;
  deUint32 err;
  GLuint GVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GLenum target_00;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8d57,&this->m_max_samples);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetIntegerv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x155);
  if (this->m_max_samples == 0) {
    this->m_max_samples = 1;
  }
  target_00 = 0x8c1a;
  if (target == 0x9100) {
    target_00 = 0xde1;
  }
  cleanSourceTexture(this);
  prepareSourceTexture(this,descriptor,target_00);
  prepareDestinationTextureAndFramebuffer(this,descriptor,target);
  GVar2 = prepareProgram(this,target_00,descriptor,COMPONENTS_COUNT);
  this->m_program = GVar2;
  makeProgramAndSourceTextureActive(this,target_00);
  drawQuad(this);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_framebuffer != 0) {
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x440))(1,&this->m_framebuffer);
    this->m_framebuffer = 0;
  }
  cleanSourceTexture(this);
  this->m_source_texture = this->m_destination_texture;
  this->m_destination_texture = 0;
  cleanProgram(this);
  return;
}

Assistant:

void FunctionalTest::renderDataIntoMultisampledTexture(TextureInternalFormatDescriptor descriptor, glw::GLenum target)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch limits. */
	gl.getIntegerv(GL_MAX_SAMPLES, &m_max_samples);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv have failed");

	if (m_max_samples == 0)
	{
		m_max_samples = 1;
	}

	/* Setup target. */
	glw::GLenum non_ms_target = (target == GL_TEXTURE_2D_MULTISAMPLE) ? GL_TEXTURE_2D : GL_TEXTURE_2D_ARRAY;

	/* Cleanup required by prepareSourceTexture(...). */
	cleanSourceTexture();

	/* Prepare textures and program. */
	prepareSourceTexture(descriptor, non_ms_target);

	prepareDestinationTextureAndFramebuffer(descriptor, target);

	m_program = prepareProgram(non_ms_target, descriptor, COMPONENTS_COUNT);

	/* Setup GL and render texture. */
	makeProgramAndSourceTextureActive(non_ms_target);

	drawQuad();

	/* Cleanup. */
	cleanFramebuffer();
	cleanSourceTexture();

	/* Swpaing destination texture to source texture. */
	m_source_texture = m_destination_texture;

	m_destination_texture = 0;

	/* Clean program. */
	cleanProgram();
}